

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O1

double CEDate::CurrentJD(void)

{
  double dVar1;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> date_info;
  time_t now;
  tm current_jd;
  allocator<double> local_a9;
  double local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<double,_std::allocator<double>_> local_88;
  time_t local_70;
  undefined1 local_68 [16];
  double local_58;
  double local_50;
  tm local_48;
  
  time(&local_70);
  gmtime_r(&local_70,&local_48);
  dVar1 = (double)local_48.tm_mon + 1.0;
  local_68._8_4_ = SUB84(dVar1,0);
  local_68._0_8_ = (double)local_48.tm_year + 1900.0;
  local_68._12_4_ = (int)((ulong)dVar1 >> 0x20);
  local_58 = (double)local_48.tm_mday;
  local_50 = CETime::CurrentUTC();
  local_50 = local_50 / 86400.0;
  std::allocator<double>::allocator(&local_a9);
  __l._M_len = 4;
  __l._M_array = (iterator)local_68;
  std::vector<double,_std::allocator<double>_>::vector(&local_88,__l,&local_a9);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_a9);
  std::vector<double,_std::allocator<double>_>::vector(&local_a0,&local_88);
  local_a8 = GregorianVect2JD(&local_a0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_a0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_88);
  return local_a8;
}

Assistant:

double CEDate::CurrentJD()
{
    // Get the current date information
    time_t now ;
    time (&now) ;
    struct tm current_jd;
    gmtime_r(&now, &current_jd) ;
    
    // Put this into a vector
    std::vector<double> date_info = {current_jd.tm_year+1900.0,
                                     current_jd.tm_mon+1.0,
                                     current_jd.tm_mday*1.0,
                                     CETime::CurrentUTC()/DAYSEC} ;
    
    // Convert the Gregorian date information into a Julian date
    return GregorianVect2JD( date_info ) ;
}